

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<std::__exception_ptr::exception_ptr_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<std::__exception_ptr::exception_ptr_const&> *this,exception_ptr *rhs)

{
  lest *this_00;
  void *pvVar1;
  void *pvVar2;
  exception_ptr *in_R8;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  this_00 = *(lest **)this;
  pvVar1 = *(void **)this_00;
  pvVar2 = rhs->_M_exception_object;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"==","");
  to_string<std::__exception_ptr::exception_ptr,std::__exception_ptr::exception_ptr>
            (&local_50,this_00,(exception_ptr *)local_70,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = pvVar1 == pvVar2;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }